

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::
     class_<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::unique_ptr<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::default_delete<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>_>
     ::dealloc(value_and_holder *v_h)

{
  bool bVar1;
  void **ppvVar2;
  value_and_holder *in_RDI;
  error_scope scope;
  size_t in_stack_ffffffffffffffd8;
  unique_ptr<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::default_delete<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  error_scope::error_scope((error_scope *)0x38ed03);
  bVar1 = pybind11::detail::value_and_holder::holder_constructed(in_RDI);
  if (bVar1) {
    pybind11::detail::value_and_holder::
    holder<std::unique_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::default_delete<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>>
              (in_RDI);
    std::
    unique_ptr<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::default_delete<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>
    ::~unique_ptr(in_stack_ffffffffffffffe0);
    pybind11::detail::value_and_holder::set_holder_constructed(in_RDI,false);
  }
  else {
    pybind11::detail::value_and_holder::
    value_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>
              (in_RDI);
    pybind11::detail::call_operator_delete
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0x38ed5f);
  }
  ppvVar2 = pybind11::detail::value_and_holder::value_ptr<void>(in_RDI);
  *ppvVar2 = (void *)0x0;
  error_scope::~error_scope((error_scope *)0x38ed7a);
  return;
}

Assistant:

static void dealloc(detail::value_and_holder &v_h) {
        // We could be deallocating because we are cleaning up after a Python exception.
        // If so, the Python error indicator will be set. We need to clear that before
        // running the destructor, in case the destructor code calls more Python.
        // If we don't, the Python API will exit with an exception, and pybind11 will
        // throw error_already_set from the C++ destructor which is forbidden and triggers
        // std::terminate().
        error_scope scope;
        if (v_h.holder_constructed()) {
            v_h.holder<holder_type>().~holder_type();
            v_h.set_holder_constructed(false);
        }
        else {
            detail::call_operator_delete(v_h.value_ptr<type>(),
                v_h.type->type_size,
                v_h.type->type_align
            );
        }
        v_h.value_ptr() = nullptr;
    }